

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_integrate_error(REF_GRID ref_grid,REF_DBL *interpolation_error,REF_DBL *total_error)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  REF_CELL *ppRVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  int cell;
  REF_DBL volume;
  REF_LONG ntet;
  REF_INT nodes [27];
  double local_c8;
  REF_GRID local_c0;
  long local_b8;
  long local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  uVar4 = ref_cell_ncell(ref_grid->cell[8],ref_node,&local_b0);
  if (uVar4 == 0) {
    local_b8 = local_b0;
    ppRVar6 = ref_grid->cell + 3;
    if (0 < local_b0) {
      ppRVar6 = ref_grid->cell + 8;
    }
    ref_cell = *ppRVar6;
    *total_error = 0.0;
    local_c0 = ref_grid;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar5 == 0) {
          if (local_b8 < 1) {
            uVar4 = ref_node_tri_area(ref_node,local_a8,&local_c8);
            if (uVar4 != 0) {
              pcVar9 = "area";
              uVar7 = 0x41c;
              goto LAB_001c2d0c;
            }
          }
          else {
            uVar4 = ref_node_tet_vol(ref_node,local_a8,&local_c8);
            if (uVar4 != 0) {
              pcVar9 = "vol";
              uVar7 = 0x41a;
              goto LAB_001c2d0c;
            }
          }
          iVar1 = ref_cell->node_per;
          if (0 < (long)iVar1) {
            pRVar3 = ref_node->part;
            iVar2 = ref_node->ref_mpi->id;
            lVar8 = 0;
            do {
              if (iVar2 == pRVar3[local_a8[lVar8]]) {
                *total_error = (interpolation_error[local_a8[lVar8]] * local_c8) / (double)iVar1 +
                               *total_error;
              }
              lVar8 = lVar8 + 1;
            } while (iVar1 != lVar8);
          }
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    uVar4 = ref_mpi_allsum(local_c0->mpi,total_error,1,3);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar9 = "dbl sum";
    uVar7 = 0x426;
  }
  else {
    pcVar9 = "count";
    uVar7 = 0x410;
  }
LAB_001c2d0c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
         "ref_metric_integrate_error",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate_error(REF_GRID ref_grid,
                                              REF_DBL *interpolation_error,
                                              REF_DBL *total_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL volume;
  REF_BOOL have_tet;
  REF_LONG ntet;
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "count");
  have_tet = (0 < ntet);
  if (have_tet) {
    ref_cell = ref_grid_tet(ref_grid);
  } else {
    ref_cell = ref_grid_tri(ref_grid);
  }
  *total_error = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (have_tet) {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    } else {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    }
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        (*total_error) += interpolation_error[nodes[cell_node]] * volume /
                          ((REF_DBL)ref_cell_node_per(ref_cell));
      }
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), total_error, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}